

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::StrongWeakAssertionExpr::fromSyntax
          (StrongWeakPropertyExprSyntax *syntax,ASTContext *context)

{
  Scope *pSVar1;
  SequenceExprSyntax *pSVar2;
  Compilation *this;
  SyntaxNode *this_00;
  bool bVar3;
  undefined4 in_EAX;
  int iVar4;
  undefined4 extraout_var;
  StrongWeakAssertionExpr *pSVar5;
  char *func;
  SourceRange sourceRange;
  undefined8 uStack_28;
  AssertionExpr *this_01;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    pSVar2 = (syntax->expr).ptr;
    if (pSVar2 != (SequenceExprSyntax *)0x0) {
      this = pSVar1->compilation;
      uStack_28._0_4_ = in_EAX;
      iVar4 = AssertionExpr::bind((int)pSVar2,(sockaddr *)context,0);
      this_01 = (AssertionExpr *)CONCAT44(extraout_var,iVar4);
      AssertionExpr::requireSequence(this_01,context,(DiagCode)0x300008);
      bVar3 = AssertionExpr::admitsEmpty(this_01);
      if (!bVar3) {
LAB_00385705:
        uStack_28 = (ulong)CONCAT14((syntax->keyword).kind != StrongKeyword,(undefined4)uStack_28);
        pSVar5 = BumpAllocator::
                 emplace<slang::ast::StrongWeakAssertionExpr,slang::ast::AssertionExpr_const&,slang::ast::StrongWeakAssertionExpr::Strength>
                           (&this->super_BumpAllocator,this_01,(Strength *)((long)&uStack_28 + 4));
        return &pSVar5->super_AssertionExpr;
      }
      this_00 = &((syntax->expr).ptr)->super_SyntaxNode;
      if (this_00 != (SyntaxNode *)0x0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00);
        ASTContext::addDiag(context,(DiagCode)0x3f0008,sourceRange);
        goto LAB_00385705;
      }
    }
    func = 
    "T slang::not_null<slang::syntax::SequenceExprSyntax *>::get() const [T = slang::syntax::SequenceExprSyntax *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

bool visitInvalid(const AssertionExpr&) { return false; }